

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O1

dxil_spv_result dxil_spv_parse_dxil_blob(void *data,size_t size,dxil_spv_parsed_blob *blob)

{
  pointer puVar1;
  pointer pcVar2;
  bool bVar3;
  dxil_spv_parsed_blob this;
  Vector<uint8_t> *pVVar4;
  Vector<RDATSubobject> *pVVar5;
  LLVMBCParser *parser_00;
  dxil_spv_result dVar6;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *name;
  pointer entry;
  Vector<String> names;
  DXILContainerParser parser;
  Vector<String> local_1b0;
  EntryPoint local_198;
  DXILContainerParser local_98;
  
  this = (dxil_spv_parsed_blob)operator_new(0x70,(nothrow_t *)&std::nothrow);
  if (this == (dxil_spv_parsed_blob)0x0) {
    this = (dxil_spv_parsed_blob)0x0;
  }
  else {
    dxil_spv::LLVMBCParser::LLVMBCParser((LLVMBCParser *)this);
    (this->disasm)._M_dataplus._M_p = (pointer)&(this->disasm).field_2;
    (this->disasm)._M_string_length = 0;
    (this->disasm).field_2._M_local_buf[0] = '\0';
    (this->dxil_blob).
    super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->dxil_blob).
    super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->dxil_blob).
    super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->rdat_subobjects).
    super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->rdat_subobjects).
    super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->rdat_subobjects).
    super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->entry_points).
    super__Vector_base<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->entry_points).
    super__Vector_base<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->entry_points).
    super__Vector_base<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  if (this == (dxil_spv_parsed_blob)0x0) {
    return DXIL_SPV_ERROR_OUT_OF_MEMORY;
  }
  local_98.rdat_subobjects.
  super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.rdat_subobjects.
  super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.output_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.rdat_subobjects.
  super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.output_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.output_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.input_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.input_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.dxil_blob.
  super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.input_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.dxil_blob.
  super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.dxil_blob.
  super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar3 = dxil_spv::DXILContainerParser::parse_container(&local_98,data,size,false);
  if (bVar3) {
    pVVar4 = dxil_spv::DXILContainerParser::get_blob(&local_98);
    std::vector<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>::_M_move_assign
              (&this->dxil_blob,pVVar4);
    pVVar5 = dxil_spv::DXILContainerParser::get_rdat_subobjects(&local_98);
    std::vector<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>::
    _M_move_assign(&this->rdat_subobjects,pVVar5);
    puVar1 = (this->dxil_blob).
             super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    bVar3 = dxil_spv::LLVMBCParser::parse
                      (&this->bc,puVar1,
                       (long)(this->dxil_blob).
                             super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
    if (bVar3) {
      dxil_spv::Converter::get_entry_points_abi_cxx11_(&local_1b0,(Converter *)this,parser_00);
      if (local_1b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        entry = local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_198.mangled._M_dataplus._M_p = (pointer)&local_198.mangled.field_2;
          pcVar2 = (entry->_M_dataplus)._M_p;
          std::__cxx11::
          basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
          _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                               *)&local_198,pcVar2,pcVar2 + entry->_M_string_length);
          dxil_spv::demangle_entry_point(&local_198.demangled,entry);
          dxil_spv::Converter::get_node_input
                    (&local_198.node_input,&this->bc,(entry->_M_dataplus)._M_p);
          dxil_spv::Converter::get_node_outputs
                    (&local_198.node_outputs,&this->bc,(entry->_M_dataplus)._M_p);
          std::
          vector<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
          ::emplace_back<dxil_spv_parsed_blob_s::EntryPoint>(&this->entry_points,&local_198);
          std::
          vector<dxil_spv::NodeOutputData,_dxil_spv::ThreadLocalAllocator<dxil_spv::NodeOutputData>_>
          ::~vector(&local_198.node_outputs);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
               *)local_198.node_input.node_share_input_id._M_dataplus._M_p !=
              &local_198.node_input.node_share_input_id.field_2) {
            dxil_spv::free_in_thread(local_198.node_input.node_share_input_id._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
               *)local_198.node_input.node_id._M_dataplus._M_p !=
              &local_198.node_input.node_id.field_2) {
            dxil_spv::free_in_thread(local_198.node_input.node_id._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
               *)local_198.demangled._M_dataplus._M_p != &local_198.demangled.field_2) {
            dxil_spv::free_in_thread(local_198.demangled._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
               *)local_198.mangled._M_dataplus._M_p != &local_198.mangled.field_2) {
            dxil_spv::free_in_thread(local_198.mangled._M_dataplus._M_p);
          }
          entry = entry + 1;
        } while (entry != local_1b0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      *blob = this;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
      ::~vector(&local_1b0);
      dVar6 = DXIL_SPV_SUCCESS;
      goto LAB_0010b303;
    }
    std::
    vector<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
    ::~vector(&this->entry_points);
  }
  else {
    std::
    vector<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
    ::~vector(&this->entry_points);
  }
  std::vector<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>::
  ~vector(&this->rdat_subobjects);
  puVar1 = (this->dxil_blob).
           super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    dxil_spv::free_in_thread(puVar1);
  }
  pcVar2 = (this->disasm)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)pcVar2 != &(this->disasm).field_2) {
    dxil_spv::free_in_thread(pcVar2);
  }
  dxil_spv::LLVMBCParser::~LLVMBCParser(&this->bc);
  operator_delete(this,0x70);
  dVar6 = DXIL_SPV_ERROR_PARSER;
LAB_0010b303:
  std::vector<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>::
  ~vector(&local_98.rdat_subobjects);
  std::vector<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>::~vector
            (&local_98.output_elements);
  std::vector<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>::~vector
            (&local_98.input_elements);
  if (local_98.dxil_blob.
      super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    dxil_spv::free_in_thread
              (local_98.dxil_blob.
               super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  }
  return dVar6;
}

Assistant:

dxil_spv_result dxil_spv_parse_dxil_blob(const void *data, size_t size, dxil_spv_parsed_blob *blob)
{
	auto *parsed = new (std::nothrow) dxil_spv_parsed_blob_s;
	if (!parsed)
		return DXIL_SPV_ERROR_OUT_OF_MEMORY;

	DXILContainerParser parser;
	if (!parser.parse_container(data, size, false))
	{
		delete parsed;
		return DXIL_SPV_ERROR_PARSER;
	}

	parsed->dxil_blob = std::move(parser.get_blob());
	parsed->rdat_subobjects = std::move(parser.get_rdat_subobjects());

	if (!parsed->bc.parse(parsed->dxil_blob.data(), parsed->dxil_blob.size()))
	{
		delete parsed;
		return DXIL_SPV_ERROR_PARSER;
	}

	auto names = Converter::get_entry_points(parsed->bc);
	for (auto &name : names)
	{
		parsed->entry_points.push_back({
			name, demangle_entry_point(name),
			Converter::get_node_input(parsed->bc, name.c_str()),
			Converter::get_node_outputs(parsed->bc, name.c_str())
		});
	}

	*blob = parsed;
	return DXIL_SPV_SUCCESS;
}